

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O2

void Amap_ManCreate(Amap_Man_t *p,Aig_Man_t *pAig)

{
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Amap_Obj_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  Amap_Obj_t *pAVar10;
  int iVar11;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Vec_Ptr_t *local_60;
  Amap_Obj_t *pChoices [4];
  
  if (pAig->pEquivs == (Aig_Obj_t **)0x0) {
    p_00 = Aig_ManDfs(pAig,1);
  }
  else {
    p_00 = Aig_ManDfsChoices(pAig);
  }
  pAVar3 = Amap_ManCreateConst1(p);
  p->pConst1 = pAVar3;
  if (p->pPars->fVerbose != 0) {
    if (0.1 < (double)(pAig->vObjs->nSize - pAig->nDeleted) * 96.0 * 9.313225746154785e-10) {
      printf("Warning: Mapper allocates %.3f GB for subject graph with %d objects.\n");
    }
  }
  Aig_ManCleanData(pAig);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar11 = 0; iVar11 < pAig->vCis->nSize; iVar11 = iVar11 + 1) {
    pvVar4 = Vec_PtrEntry(pAig->vCis,iVar11);
    pAVar3 = Amap_ManCreatePi(p);
    *(Amap_Obj_t **)((long)pvVar4 + 0x28) = pAVar3;
  }
  iVar11 = 0;
  local_60 = p_00;
  do {
    if (p_00->nSize <= iVar11) {
      free(p_00->pArray);
      free(p_00);
      for (iVar11 = 0; iVar11 < pAig->vCos->nSize; iVar11 = iVar11 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar11);
        pAVar3 = (Amap_Obj_t *)Aig_ObjChild0Copy(pAVar5);
        pAVar3 = Amap_ManCreatePo(p,pAVar3);
        (pAVar5->field_5).pData = pAVar3;
      }
      if (p->pPars->fVerbose != 0) {
        printf("Performing mapping with %d given and %d created choices.\n",
               (ulong)(uint)p->nChoicesGiven,(ulong)(uint)p->nChoicesAdded);
      }
      return;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar11);
    if (p->fUseXor == 0) {
LAB_0039b417:
      bVar1 = true;
      if (p->fUseMux != 0) {
        iVar2 = Aig_ObjIsMuxType(pAVar5);
        if (iVar2 != 0) {
          pAVar6 = Aig_ObjRecognizeMux(pAVar5,&pFan1,&pFan0);
          Amap_ManCreateMuxChoices
                    (p,(Amap_Obj_t *)
                       ((ulong)((uint)pFan0 & 1) ^
                       *(ulong *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x28)),
                     (Amap_Obj_t *)
                     ((ulong)((uint)pFan1 & 1) ^
                     *(ulong *)(((ulong)pFan1 & 0xfffffffffffffffe) + 0x28)),
                     (Amap_Obj_t *)
                     ((ulong)((uint)pAVar6 & 1) ^
                     *(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x28)),pChoices);
          goto LAB_0039b482;
        }
      }
    }
    else {
      iVar2 = Aig_ObjRecognizeExor(pAVar5,&pFan0,&pFan1);
      if (iVar2 == 0) goto LAB_0039b417;
      Amap_ManCreateXorChoices
                (p,(Amap_Obj_t *)
                   ((ulong)((uint)pFan0 & 1) ^
                   *(ulong *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x28)),
                 (Amap_Obj_t *)
                 ((ulong)((uint)pFan1 & 1) ^ *(ulong *)(((ulong)pFan1 & 0xfffffffffffffffe) + 0x28))
                 ,pChoices);
LAB_0039b482:
      bVar1 = false;
    }
    pAVar3 = (Amap_Obj_t *)Aig_ObjChild0Copy(pAVar5);
    if (((ulong)pAVar5 & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
    }
    uVar8 = (ulong)pAVar5->pFanin1 & 0xfffffffffffffffe;
    if (uVar8 == 0) {
      pAVar10 = (Amap_Obj_t *)0x0;
    }
    else {
      pAVar10 = (Amap_Obj_t *)((ulong)((uint)pAVar5->pFanin1 & 1) ^ *(ulong *)(uVar8 + 0x28));
    }
    pAVar10 = Amap_ManCreateAnd(p,pAVar3,pAVar10);
    pAVar3 = pChoices[0];
    (pAVar5->field_5).pData = pAVar10;
    if (!bVar1) {
      p->nChoicesAdded = p->nChoicesAdded + 1;
      Amap_ObjSetChoice((Amap_Obj_t *)(pAVar5->field_5).pData,pChoices[0]);
      pAVar10 = pChoices[1];
      Amap_ObjSetChoice(pAVar3,pChoices[1]);
      pAVar3 = pChoices[2];
      p_00 = local_60;
      Amap_ObjSetChoice(pAVar10,pChoices[2]);
      Amap_ObjSetChoice(pAVar3,pChoices[3]);
      Amap_ManCreateChoice(p,(Amap_Obj_t *)(pAVar5->field_5).pData);
    }
    if (((pAig->pEquivs != (Aig_Obj_t **)0x0) &&
        (pAVar6 = pAig->pEquivs[pAVar5->Id], pAVar6 != (Aig_Obj_t *)0x0)) &&
       ((*(uint *)&pAVar5->field_0x18 & 0xffffffc0) != 0)) {
      p->nChoicesGiven = p->nChoicesGiven + 1;
      pAVar9 = pAVar5;
      while (pAVar7 = pAVar6, pAVar7 != (Aig_Obj_t *)0x0) {
        *(ulong *)(pAVar7->field_5).pData = *(pAVar7->field_5).pData & 0xbfffffffffffffff;
        pAVar3 = Amap_ManGetLast_rec(p,(Amap_Obj_t *)(pAVar9->field_5).pData);
        Amap_ObjSetChoice(pAVar3,(Amap_Obj_t *)(pAVar7->field_5).pData);
        pAVar6 = (Aig_Obj_t *)0x0;
        pAVar9 = pAVar7;
        if (pAig->pEquivs != (Aig_Obj_t **)0x0) {
          pAVar6 = pAig->pEquivs[pAVar7->Id];
        }
      }
      Amap_ManCreateChoice(p,(Amap_Obj_t *)(pAVar5->field_5).pData);
      p_00 = local_60;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void Amap_ManCreate( Amap_Man_t * p, Aig_Man_t * pAig )
{
    Vec_Ptr_t * vNodes;
    Amap_Obj_t * pChoices[4];
    Aig_Obj_t * pObj, * pFanin, * pPrev, * pFan0, * pFan1, * pFanC;
    int i, fChoices;
    if ( pAig->pEquivs )
        vNodes = Aig_ManDfsChoices( pAig );
    else
        vNodes = Aig_ManDfs( pAig, 1 );
    p->pConst1 = Amap_ManCreateConst1( p );
    // print warning about excessive memory usage
    if ( p->pPars->fVerbose )
    {
        if ( 1.0 * Aig_ManObjNum(pAig) * sizeof(Amap_Obj_t) / (1<<30) > 0.1 )
        printf( "Warning: Mapper allocates %.3f GB for subject graph with %d objects.\n", 
            1.0 * Aig_ManObjNum(pAig) * sizeof(Amap_Obj_t) / (1<<30), Aig_ManObjNum(pAig) );
    }
    // create PIs and remember them in the old nodes
    Aig_ManCleanData(pAig);
    Aig_ManConst1(pAig)->pData = Amap_ManConst1( p );
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Amap_ManCreatePi( p );
    // load the AIG into the mapper
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        fChoices = 0;
        if ( p->fUseXor && Aig_ObjRecognizeExor(pObj, &pFan0, &pFan1 ) )
        {
            Amap_ManCreateXorChoices( p, Amap_AndToObj(pFan0), Amap_AndToObj(pFan1), pChoices );
            fChoices = 1;
        }
        else if ( p->fUseMux && Aig_ObjIsMuxType(pObj) )
        {
            pFanC = Aig_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            Amap_ManCreateMuxChoices( p, Amap_AndToObj(pFan0), Amap_AndToObj(pFan1), Amap_AndToObj(pFanC), pChoices );
            fChoices = 1;
        }
        pObj->pData = Amap_ManCreateAnd( p, (Amap_Obj_t *)Aig_ObjChild0Copy(pObj), (Amap_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( fChoices )
        {
            p->nChoicesAdded++;
            Amap_ObjSetChoice( (Amap_Obj_t *)pObj->pData, pChoices[0] );
            Amap_ObjSetChoice( pChoices[0], pChoices[1] );
            Amap_ObjSetChoice( pChoices[1], pChoices[2] );
            Amap_ObjSetChoice( pChoices[2], pChoices[3] );
            Amap_ManCreateChoice( p, (Amap_Obj_t *)pObj->pData );
        }
        if ( Aig_ObjIsChoice( pAig, pObj ) )
        {
//            assert( !fChoices );
            p->nChoicesGiven++;
            for ( pPrev = pObj, pFanin = Aig_ObjEquiv(pAig, pObj); pFanin; pPrev = pFanin, pFanin = Aig_ObjEquiv(pAig, pFanin) )
            {
                ((Amap_Obj_t *)pFanin->pData)->fRepr = 0;
                Amap_ObjSetChoice( Amap_ManGetLast_rec(p, (Amap_Obj_t *)pPrev->pData), 
                    (Amap_Obj_t *)pFanin->pData );
            }
            Amap_ManCreateChoice( p, (Amap_Obj_t *)pObj->pData );
        }
    }
    Vec_PtrFree( vNodes );
    // set the primary outputs without copying the phase
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->pData = Amap_ManCreatePo( p, (Amap_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->fVerbose )
        printf( "Performing mapping with %d given and %d created choices.\n", 
            p->nChoicesGiven, p->nChoicesAdded );
}